

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_format(lua_State *L)

{
  uint uVar1;
  char *pcVar2;
  unsigned_long uVar3;
  void *pvVar4;
  GCstr *pGVar5;
  undefined1 *puVar6;
  lua_State *in_RDI;
  lua_Number lVar7;
  GCstr *str;
  size_t len;
  char nbuf [32];
  char *p;
  TValue tv;
  char buff [512];
  char form [18];
  luaL_Buffer b;
  char *strfrmt_end;
  char *strfrmt;
  GCstr *fmt;
  int top;
  int arg;
  int in_stack_ffffffffffffdccc;
  cTValue *in_stack_ffffffffffffdcd0;
  int idx;
  lua_State *in_stack_ffffffffffffdcd8;
  undefined7 in_stack_ffffffffffffdce0;
  undefined1 in_stack_ffffffffffffdce7;
  cTValue *in_stack_ffffffffffffdce8;
  lua_State *in_stack_ffffffffffffdcf0;
  cTValue *in_stack_ffffffffffffdcf8;
  lua_State *in_stack_ffffffffffffdd00;
  undefined8 local_22d0;
  undefined1 local_22c8 [32];
  char *local_22a8;
  undefined8 local_22a0;
  cTValue local_2298 [6];
  undefined1 local_2098 [32];
  luaL_Buffer local_2078;
  GCstr *local_60;
  GCstr *local_58;
  GCstr *local_50;
  int local_48;
  int local_44;
  lua_State *local_40;
  GCstr *local_38;
  TValue *local_30;
  lua_State *local_28;
  undefined4 local_1c;
  GCstr *local_18;
  TValue *local_10;
  lua_State *local_8;
  
  local_44 = 1;
  local_48 = (int)((long)in_RDI->top - (long)in_RDI->base >> 3);
  local_40 = in_RDI;
  local_50 = lj_lib_checkstr((lua_State *)
                             CONCAT17(in_stack_ffffffffffffdce7,in_stack_ffffffffffffdce0),
                             (int)((ulong)in_stack_ffffffffffffdcd8 >> 0x20));
  local_58 = local_50 + 1;
  local_60 = (GCstr *)((long)&(local_58->nextgc).gcptr32 + (ulong)local_50->len);
  luaL_buffinit(local_40,&local_2078);
LAB_001873a3:
  while( true ) {
    while( true ) {
      if (local_60 <= local_58) {
        luaL_pushresult((luaL_Buffer *)0x1879e3);
        return 1;
      }
      if ((char)(local_58->nextgc).gcptr32 == '%') break;
      if (&local_60 <= local_2078.p) {
        luaL_prepbuffer((luaL_Buffer *)0x1873fc);
      }
      *local_2078.p = (char)(local_58->nextgc).gcptr32;
      local_2078.p = (char *)((long)local_2078.p + 1);
      local_58 = (GCstr *)((long)&(local_58->nextgc).gcptr32 + 1);
    }
    puVar6 = (undefined1 *)((long)&(local_58->nextgc).gcptr32 + 1);
    if (*(char *)((long)&(local_58->nextgc).gcptr32 + 1) != '%') break;
    local_58 = (GCstr *)puVar6;
    if (&local_60 <= local_2078.p) {
      luaL_prepbuffer((luaL_Buffer *)0x187495);
    }
    *local_2078.p = *(undefined1 *)local_58;
    local_2078.p = (char *)((long)local_2078.p + 1);
    local_58 = (GCstr *)((long)local_58 + 1);
  }
  local_44 = local_44 + 1;
  local_58 = (GCstr *)puVar6;
  if (local_48 < local_44) {
    luaL_argerror((lua_State *)&in_stack_ffffffffffffdcd0->field_2,in_stack_ffffffffffffdccc,
                  (char *)0x187510);
  }
  pcVar2 = scanformat((lua_State *)CONCAT17(in_stack_ffffffffffffdce7,in_stack_ffffffffffffdce0),
                      (char *)in_stack_ffffffffffffdcd8,(char *)&in_stack_ffffffffffffdcd0->u64);
  local_58 = (GCstr *)(pcVar2 + 1);
  idx = (int)((ulong)in_stack_ffffffffffffdcd0 >> 0x20);
  switch(*pcVar2) {
  case 'A':
  case 'E':
  case 'G':
  case 'a':
  case 'e':
  case 'f':
  case 'g':
    lVar7 = lj_lib_checknum((lua_State *)&in_stack_ffffffffffffdcd0->field_2,
                            in_stack_ffffffffffffdccc);
    local_22a0._4_4_ = (int)((ulong)lVar7 >> 0x20);
    local_22a0 = lVar7;
    if ((uint)(local_22a0._4_4_ << 1) < 0xffe00000) {
      sprintf((char *)&local_2298[0].u64,local_2098,lVar7);
    }
    else {
      local_22d0 = lj_str_bufnum((char *)in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdcd0);
      if (*(char *)((long)&local_58[-1].len + 3) < 'a') {
        local_22c8[local_22d0 - 3] = local_22c8[local_22d0 - 3] + -0x20;
        local_22c8[local_22d0 - 2] = local_22c8[local_22d0 - 2] + -0x20;
        local_22c8[local_22d0 - 1] = local_22c8[local_22d0 - 1] + -0x20;
      }
      local_22c8[local_22d0] = 0;
      local_22a8 = local_2098;
      while( true ) {
        in_stack_ffffffffffffdce7 = false;
        if (*local_22a8 < 'A') {
          in_stack_ffffffffffffdce7 = *local_22a8 != '.';
        }
        if ((bool)in_stack_ffffffffffffdce7 == false) break;
        local_22a8 = local_22a8 + 1;
      }
      *local_22a8 = 's';
      local_22a8[1] = '\0';
      local_22a8 = local_22a8 + 1;
      sprintf((char *)&local_2298[0].u64,local_2098,local_22c8);
    }
    break;
  default:
    lj_err_callerv(local_40,LJ_ERR_STRFMTO,(ulong)(uint)(int)*pcVar2);
  case 'X':
  case 'o':
  case 'u':
  case 'x':
    addintlen((char *)&in_stack_ffffffffffffdcd0->u64);
    in_stack_ffffffffffffdce8 = local_2298;
    in_stack_ffffffffffffdcf0 = (lua_State *)local_2098;
    uVar3 = num2uintfrm(in_stack_ffffffffffffdcd8,(int)((ulong)in_stack_ffffffffffffdcd0 >> 0x20));
    sprintf((char *)&in_stack_ffffffffffffdce8->u64,(char *)in_stack_ffffffffffffdcf0,uVar3);
    break;
  case 'c':
    uVar1 = lj_lib_checkint(in_stack_ffffffffffffdcd8,idx);
    sprintf((char *)&local_2298[0].u64,local_2098,(ulong)uVar1);
    break;
  case 'd':
  case 'i':
    addintlen((char *)&in_stack_ffffffffffffdcd0->u64);
    in_stack_ffffffffffffdcf8 = local_2298;
    in_stack_ffffffffffffdd00 = (lua_State *)local_2098;
    uVar3 = num2intfrm((lua_State *)&in_stack_ffffffffffffdcd0->field_2,in_stack_ffffffffffffdccc);
    sprintf((char *)&in_stack_ffffffffffffdcf8->u64,(char *)in_stack_ffffffffffffdd00,uVar3);
    break;
  case 'p':
    in_stack_ffffffffffffdcd8 = local_40;
    pvVar4 = lua_topointer(local_40,idx);
    lj_str_pushf(in_stack_ffffffffffffdcd8,"%p",pvVar4);
    luaL_addvalue((luaL_Buffer *)CONCAT17(in_stack_ffffffffffffdce7,in_stack_ffffffffffffdce0));
    goto LAB_001873a3;
  case 'q':
    addquoted(in_stack_ffffffffffffdd00,(luaL_Buffer *)&in_stack_ffffffffffffdcf8->field_2,
              (int)((ulong)in_stack_ffffffffffffdcf0 >> 0x20));
    goto LAB_001873a3;
  case 's':
    pGVar5 = meta_tostring(in_stack_ffffffffffffdcf0,(int)((ulong)in_stack_ffffffffffffdce8 >> 0x20)
                          );
    pcVar2 = strchr(local_2098,0x2e);
    if ((pcVar2 != (char *)0x0) || (pGVar5->len < 100)) {
      sprintf((char *)&local_2298[0].u64,local_2098,pGVar5 + 1);
      break;
    }
    local_30 = local_40->top;
    local_40->top = local_30 + 1;
    local_28 = local_40;
    local_8 = local_40;
    local_1c = 0xfffffffb;
    (local_30->u32).lo = (uint32_t)pGVar5;
    (local_30->field_2).it = 0xfffffffb;
    local_38 = pGVar5;
    local_18 = pGVar5;
    local_10 = local_30;
    luaL_addvalue((luaL_Buffer *)CONCAT17(in_stack_ffffffffffffdce7,in_stack_ffffffffffffdce0));
    goto LAB_001873a3;
  }
  in_stack_ffffffffffffdcd0 = local_2298;
  strlen((char *)&local_2298[0].u64);
  luaL_addlstring((luaL_Buffer *)CONCAT17(in_stack_ffffffffffffdce7,in_stack_ffffffffffffdce0),
                  (char *)in_stack_ffffffffffffdcd8,(size_t)in_stack_ffffffffffffdcd0);
  goto LAB_001873a3;
}

Assistant:

LJLIB_CF(string_format)
{
  int arg = 1, top = (int)(L->top - L->base);
  GCstr *fmt = lj_lib_checkstr(L, arg);
  const char *strfrmt = strdata(fmt);
  const char *strfrmt_end = strfrmt + fmt->len;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC) {
      luaL_addchar(&b, *strfrmt++);
    } else if (*++strfrmt == L_ESC) {
      luaL_addchar(&b, *strfrmt++);  /* %% */
    } else { /* format item */
      char form[MAX_FMTSPEC];  /* to store the format (`%...') */
      char buff[MAX_FMTITEM];  /* to store the formatted item */
      if (++arg > top)
	luaL_argerror(L, arg, lj_obj_typename[0]);
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
      case 'c':
	sprintf(buff, form, lj_lib_checkint(L, arg));
	break;
      case 'd':  case 'i':
	addintlen(form);
	sprintf(buff, form, num2intfrm(L, arg));
	break;
      case 'o':  case 'u':  case 'x':  case 'X':
	addintlen(form);
	sprintf(buff, form, num2uintfrm(L, arg));
	break;
      case 'e':  case 'E': case 'f': case 'g': case 'G': case 'a': case 'A': {
	TValue tv;
	tv.n = lj_lib_checknum(L, arg);
	if (LJ_UNLIKELY((tv.u32.hi << 1) >= 0xffe00000)) {
	  /* Canonicalize output of non-finite values. */
	  char *p, nbuf[LJ_STR_NUMBUF];
	  size_t len = lj_str_bufnum(nbuf, &tv);
	  if (strfrmt[-1] < 'a') {
	    nbuf[len-3] = nbuf[len-3] - 0x20;
	    nbuf[len-2] = nbuf[len-2] - 0x20;
	    nbuf[len-1] = nbuf[len-1] - 0x20;
	  }
	  nbuf[len] = '\0';
	  for (p = form; *p < 'A' && *p != '.'; p++) ;
	  *p++ = 's'; *p = '\0';
	  sprintf(buff, form, nbuf);
	  break;
	}
	sprintf(buff, form, (double)tv.n);
	break;
	}
      case 'q':
	addquoted(L, &b, arg);
	continue;
      case 'p':
	lj_str_pushf(L, "%p", lua_topointer(L, arg));
	luaL_addvalue(&b);
	continue;
      case 's': {
	GCstr *str = meta_tostring(L, arg);
	if (!strchr(form, '.') && str->len >= 100) {
	  /* no precision and string is too long to be formatted;
	     keep original string */
	  setstrV(L, L->top++, str);
	  luaL_addvalue(&b);
	  continue;
	}
	sprintf(buff, form, strdata(str));
	break;
	}
      default:
	lj_err_callerv(L, LJ_ERR_STRFMTO, *(strfrmt -1));
	break;
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}